

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa-gpio.c
# Opt level: O2

void print_help(void)

{
  fwrite("list              List pins\n",0x1c,1,_stdout);
  fwrite("set pin level     Set pin to level (0/1)\n",0x29,1,_stdout);
  fwrite("setraw pin level  Set pin to level (0/1) via mmap (if available)\n",0x41,1,_stdout);
  fwrite("get pin           Get pin level\n",0x20,1,_stdout);
  fwrite("getraw pin        Get pin level via mmap (if available)\n",0x38,1,_stdout);
  fwrite("monitor pin       Monitor pin level changes\n",0x2c,1,_stdout);
  fwrite("version           Get mraa version and board name\n",0x32,1,_stdout);
  return;
}

Assistant:

void
print_help()
{
    fprintf(stdout, "list              List pins\n");
    fprintf(stdout, "set pin level     Set pin to level (0/1)\n");
    fprintf(stdout, "setraw pin level  Set pin to level (0/1) via mmap (if available)\n");
    fprintf(stdout, "get pin           Get pin level\n");
    fprintf(stdout, "getraw pin        Get pin level via mmap (if available)\n");
    fprintf(stdout, "monitor pin       Monitor pin level changes\n");
    fprintf(stdout, "version           Get mraa version and board name\n");
}